

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O0

vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> * __thiscall
xmrig::OclConfig::get
          (OclConfig *this,Miner *miner,OclPlatform *platform,
          vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *devices)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  char *pcVar4;
  vector<long,_std::allocator<long>_> *this_00;
  OclConfig *in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  OclThread **__s;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *in_RDI;
  OclThread *in_R8;
  int64_t affinity;
  const_iterator __end3;
  const_iterator __begin3;
  vector<long,_std::allocator<long>_> *__range3;
  OclThread *thread;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *__range1;
  OclThreads *threads;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *out;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffeb8;
  const_reference in_stack_fffffffffffffec0;
  OclDevice *in_stack_fffffffffffffed8;
  OclThread *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  OclConfig *in_stack_fffffffffffffef0;
  OclDevice *in_stack_fffffffffffffef8;
  OclThread *in_stack_ffffffffffffff00;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff10;
  char local_80 [4];
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_78;
  vector<long,_std::allocator<long>_> *local_70;
  OclDevice *local_68;
  OclThread *local_60;
  __normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
  local_58;
  vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *local_50;
  OclThreads *local_38;
  undefined1 local_29;
  OclThread *local_28;
  OclConfig *local_20;
  
  local_29 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::vector
            ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)0x20f48f);
  local_38 = Threads<xmrig::OclThreads>::get
                       ((Threads<xmrig::OclThreads> *)in_stack_fffffffffffffef0);
  bVar1 = OclThreads::isEmpty((OclThreads *)0x20f4c7);
  if (!bVar1) {
    OclThreads::count((OclThreads *)0x20f528);
    std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::reserve
              ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
               in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
    local_50 = OclThreads::data(local_38);
    local_58._M_current =
         (OclThread *)
         std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::begin
                   ((vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *)
                    in_stack_fffffffffffffeb8);
    local_60 = (OclThread *)
               std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::end
                         ((vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *)
                          in_stack_fffffffffffffeb8);
    while( true ) {
      __s = &local_60;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
                          *)in_stack_fffffffffffffec0,
                         (__normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
                          *)in_stack_fffffffffffffeb8);
      if (!bVar1) break;
      local_68 = (OclDevice *)
                 __gnu_cxx::
                 __normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
                 ::operator*(&local_58);
      pcVar2 = OclThread::index((OclThread *)local_68,(char *)__s,__c);
      sVar3 = std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::size
                        ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)local_28);
      if (((ulong)pcVar2 & 0xffffffff) < sVar3) {
        this_00 = OclThread::threads((OclThread *)local_68);
        sVar3 = std::vector<long,_std::allocator<long>_>::size(this_00);
        if (sVar3 < 2) {
          in_stack_fffffffffffffed8 = local_68;
          in_stack_fffffffffffffee0 = local_28;
          pcVar2 = OclThread::index((OclThread *)local_68,(char *)__s,__c_01);
          in_stack_fffffffffffffeec = SUB84(pcVar2,0);
          in_stack_fffffffffffffec0 =
               std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::operator[]
                         ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
                          in_stack_fffffffffffffee0,(ulong)pcVar2 & 0xffffffff);
          OclThread::threads((OclThread *)local_68);
          in_stack_fffffffffffffeb8 =
               (vector<long,_std::allocator<long>_> *)
               std::vector<long,_std::allocator<long>_>::front
                         ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffec0);
          std::vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>>::
          emplace_back<xmrig::Miner_const*&,xmrig::OclConfig_const&,xmrig::OclPlatform_const&,xmrig::OclThread_const&,xmrig::OclDevice_const&,long_const&>
                    ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                     in_stack_ffffffffffffff00,(Miner **)in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0,
                     (OclPlatform *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     (long *)in_stack_ffffffffffffff10);
        }
        else {
          in_stack_ffffffffffffff10 = OclThread::threads((OclThread *)local_68);
          local_70 = in_stack_ffffffffffffff10;
          local_78._M_current =
               (long *)std::vector<long,_std::allocator<long>_>::begin(in_stack_fffffffffffffeb8);
          _local_80 = std::vector<long,_std::allocator<long>_>::end(in_stack_fffffffffffffeb8);
          while( true ) {
            pcVar2 = local_80;
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)in_stack_fffffffffffffec0,
                               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)in_stack_fffffffffffffeb8);
            if (!bVar1) break;
            __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
            operator*(&local_78);
            in_stack_fffffffffffffef0 = local_20;
            in_stack_fffffffffffffef8 = local_68;
            in_stack_ffffffffffffff00 = local_28;
            pcVar2 = OclThread::index((OclThread *)local_68,pcVar2,__c_02);
            std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::operator[]
                      ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
                       in_stack_ffffffffffffff00,(ulong)pcVar2 & 0xffffffff);
            in_stack_fffffffffffffeb8 =
                 (vector<long,_std::allocator<long>_> *)&stack0xffffffffffffff78;
            std::vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>>::
            emplace_back<xmrig::Miner_const*&,xmrig::OclConfig_const&,xmrig::OclPlatform_const&,xmrig::OclThread_const&,xmrig::OclDevice_const&,long&>
                      ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                       in_stack_ffffffffffffff00,(Miner **)in_stack_fffffffffffffef8,
                       in_stack_fffffffffffffef0,
                       (OclPlatform *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                       (long *)in_stack_ffffffffffffff10);
            __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
            operator++(&local_78);
          }
        }
      }
      else {
        pcVar2 = ocl_tag();
        pcVar4 = OclThread::index((OclThread *)local_68,(char *)__s,__c_00);
        Log::print(INFO,
                   "%s\x1b[0;33m skip non-existing device with index \x1b[0m\x1b[1;33m%u\x1b[0m",
                   pcVar2,(ulong)pcVar4 & 0xffffffff);
      }
      __gnu_cxx::
      __normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
      ::operator++(&local_58);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<xmrig::OclLaunchData> xmrig::OclConfig::get(const Miner *miner, const OclPlatform &platform, const std::vector<OclDevice> &devices) const
{
    std::vector<OclLaunchData> out;
    const auto &threads = m_threads.get();

    if (threads.isEmpty()) {
        return out;
    }

    out.reserve(threads.count() * 2);

    for (const auto &thread : threads.data()) {
        if (thread.index() >= devices.size()) {
            LOG_INFO("%s" YELLOW(" skip non-existing device with index ") YELLOW_BOLD("%u"), ocl_tag(), thread.index());
            continue;
        }

        if (thread.threads().size() > 1) {
            for (int64_t affinity : thread.threads()) {
                out.emplace_back(miner, *this, platform, thread, devices[thread.index()], affinity);
            }
        }
        else {
            out.emplace_back(miner, *this, platform, thread, devices[thread.index()], thread.threads().front());
        }
    }

    return out;
}